

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

void __thiscall
upb::generator::WriteMiniTableSourceIncludes
          (generator *this,FileDefPtr file,MiniTableOptions *options,Output *output)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  generator *this_00;
  upb_FileDef *puVar5;
  compiler *this_01;
  undefined1 uVar6;
  string *__return_storage_ptr__;
  FileDefPtr file_00;
  char *extraout_RDX;
  FileDefPtr file_01;
  string_view filename;
  string_view format;
  string_view format_00;
  string_view filename_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string local_50;
  
  pcVar4 = upb_FileDef_Name((upb_FileDef *)this);
  this_00 = (generator *)strlen(pcVar4);
  filename._M_str = (char *)output;
  filename._M_len = (size_t)pcVar4;
  FileWarning_abi_cxx11_(&local_50,this_00,filename);
  uVar6 = SUB81(output,0);
  format._M_str = local_50._M_dataplus._M_p;
  format._M_len = local_50._M_string_length;
  Output::operator()<>((Output *)options,format);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  file_00.ptr_._1_7_ = 0;
  file_00.ptr_._0_1_ = *(byte *)&(file.ptr_)->opts;
  __return_storage_ptr__ = &local_50;
  (anonymous_namespace)::HeaderFilename_abi_cxx11_
            (__return_storage_ptr__,(_anonymous_namespace_ *)this,file_00,(bool)uVar6);
  format_00._M_str =
       "#include <stddef.h>\n#include \"upb/generated_code_support.h\"\n#include \"$0\"\n";
  format_00._M_len = 0x4a;
  Output::operator()((Output *)options,format_00,__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  iVar2 = upb_FileDef_DependencyCount((upb_FileDef *)this);
  if (0 < iVar2) {
    iVar2 = 0;
    do {
      uVar6 = SUB81(__return_storage_ptr__,0);
      if (*(char *)((long)&(file.ptr_)->opts + 2) == '\x01') {
        puVar5 = upb_FileDef_Dependency((upb_FileDef *)this,iVar2);
        pcVar4 = upb_FileDef_Name(puVar5);
        this_01 = (compiler *)strlen(pcVar4);
        filename_00._M_str = extraout_RDX;
        filename_00._M_len = (size_t)pcVar4;
        bVar1 = google::protobuf::compiler::IsKnownFeatureProto(this_01,filename_00);
        uVar6 = SUB81(__return_storage_ptr__,0);
        if (!bVar1) goto LAB_0010d6d4;
      }
      else {
LAB_0010d6d4:
        puVar5 = upb_FileDef_Dependency((upb_FileDef *)this,iVar2);
        file_01.ptr_._1_7_ = 0;
        file_01.ptr_._0_1_ = *(byte *)&(file.ptr_)->opts;
        (anonymous_namespace)::HeaderFilename_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)puVar5,file_01,(bool)uVar6);
        format_01._M_str = "#include \"$0\"\n";
        format_01._M_len = 0xe;
        __return_storage_ptr__ = &local_50;
        Output::operator()((Output *)options,format_01,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      iVar2 = iVar2 + 1;
      iVar3 = upb_FileDef_DependencyCount((upb_FileDef *)this);
    } while (iVar2 < iVar3);
  }
  format_02._M_str = "\n// Must be last.\n#include \"upb/port/def.inc\"\n\n";
  format_02._M_len = 0x2f;
  Output::operator()<>((Output *)options,format_02);
  format_03._M_str =
       "extern const struct upb_MiniTable UPB_PRIVATE(_kUpb_MiniTable_StaticallyTreeShaken);\n";
  format_03._M_len = 0x55;
  Output::operator()<>((Output *)options,format_03);
  return;
}

Assistant:

void WriteMiniTableSourceIncludes(upb::FileDefPtr file,
                                  const MiniTableOptions& options,
                                  Output& output) {
  output(FileWarning(file.name()));

  output(
      "#include <stddef.h>\n"
      "#include \"upb/generated_code_support.h\"\n"
      "#include \"$0\"\n",
      HeaderFilename(file, options.bootstrap));

  for (int i = 0; i < file.dependency_count(); i++) {
    if (options.strip_nonfunctional_codegen &&
        google::protobuf::compiler::IsKnownFeatureProto(file.dependency(i).name())) {
      // Strip feature imports for editions codegen tests.
      continue;
    }
    output("#include \"$0\"\n",
           HeaderFilename(file.dependency(i), options.bootstrap));
  }

  output(
      "\n"
      "// Must be last.\n"
      "#include \"upb/port/def.inc\"\n"
      "\n");

  output(
      "extern const struct upb_MiniTable "
      "UPB_PRIVATE(_kUpb_MiniTable_StaticallyTreeShaken);\n");
}